

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

Clump * rw::Clump::streamRead(Stream *stream)

{
  LLLink *pLVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int32 iVar5;
  Clump *this;
  FrameList_ *pFVar6;
  Geometry **geometryList;
  Geometry *pGVar7;
  Atomic *pAVar8;
  Light *this_00;
  Camera *this_01;
  int iVar9;
  Clump *this_02;
  ulong uVar10;
  uint32 version;
  FrameList_ frmlst;
  uint32 length;
  int32 buf [3];
  uint local_5c;
  LLLink *local_58;
  FrameList_ local_50;
  uint32 local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  
  bVar3 = findChunk(stream,1,&local_40,&local_5c);
  if (!bVar3) {
    streamRead();
    return (Clump *)0x0;
  }
  Stream::read32(stream,&local_3c,local_40);
  uVar2 = local_5c;
  local_58 = (LLLink *)CONCAT44(local_58._4_4_,local_38);
  this = create();
  if (this == (Clump *)0x0) {
    return (Clump *)0x0;
  }
  local_50.frames = (Frame **)0x0;
  bVar3 = findChunk(stream,0xe,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    pFVar6 = FrameList_::streamRead(&local_50,stream);
    if (pFVar6 != (FrameList_ *)0x0) {
      (this->object).parent = *local_50.frames;
      if (local_5c < 0x30400) {
        geometryList = (Geometry **)0x0;
        uVar4 = 0;
      }
      else {
        bVar3 = findChunk(stream,0x1a,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar3) {
          streamRead();
          goto LAB_0012eca0;
        }
        bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
        if (!bVar3) {
          streamRead();
          goto LAB_0012eca0;
        }
        uVar4 = Stream::readI32(stream);
        if (uVar4 == 0) {
          geometryList = (Geometry **)0x0;
          uVar4 = 0;
        }
        else {
          this_02 = (Clump *)((long)(int)uVar4 << 3);
          allocLocation =
               "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/clump.cpp line: 198"
          ;
          geometryList = (Geometry **)(*Engine::memfuncs)(this_02);
          if (geometryList == (Geometry **)0x0) {
            streamRead(this_02);
            goto LAB_0012eca0;
          }
          memset(geometryList,0,(size_t)this_02);
          if (0 < (int)uVar4) {
            uVar10 = 0;
            do {
              bVar3 = findChunk(stream,0xf,(uint32 *)0x0,(uint32 *)0x0);
              if (!bVar3) {
                streamRead();
                goto LAB_0012ec73;
              }
              pGVar7 = Geometry::streamRead(stream);
              geometryList[uVar10] = pGVar7;
              if (pGVar7 == (Geometry *)0x0) goto LAB_0012ec73;
              uVar10 = uVar10 + 1;
            } while (uVar4 != uVar10);
          }
        }
      }
      if (0 < local_3c) {
        iVar9 = local_3c;
        do {
          bVar3 = findChunk(stream,0x14,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_0012ec73;
          }
          pAVar8 = Atomic::streamReadClump(stream,&local_50,geometryList);
          if (pAVar8 == (Atomic *)0x0) goto LAB_0012ec73;
          pAVar8->clump = this;
          (pAVar8->inClump).next = &(this->atomics).link;
          pLVar1 = (this->atomics).link.prev;
          (pAVar8->inClump).prev = pLVar1;
          pLVar1->next = &pAVar8->inClump;
          (this->atomics).link.prev = &pAVar8->inClump;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      if (0 < (int)local_58 && 0x33000 < uVar2) {
        iVar9 = 0;
        do {
          bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_0012ec73;
          }
          iVar5 = Stream::readI32(stream);
          bVar3 = findChunk(stream,0x12,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_0012ec73;
          }
          this_00 = Light::streamRead(stream);
          if (this_00 == (Light *)0x0) goto LAB_0012ec73;
          ObjectWithFrame::setFrame(&this_00->object,local_50.frames[iVar5]);
          this_00->clump = this;
          (this_00->inClump).next = &(this->lights).link;
          pLVar1 = (this->lights).link.prev;
          (this_00->inClump).prev = pLVar1;
          pLVar1->next = &this_00->inClump;
          (this->lights).link.prev = &this_00->inClump;
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)local_58);
      }
      if (0 < local_34 && 0x33000 < uVar2) {
        local_58 = &(this->cameras).link;
        iVar9 = 0;
        do {
          bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_0012ec73;
          }
          iVar5 = Stream::readI32(stream);
          bVar3 = findChunk(stream,5,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar3) {
            streamRead();
            goto LAB_0012ec73;
          }
          this_01 = Camera::streamRead(stream);
          if (this_01 == (Camera *)0x0) goto LAB_0012ec73;
          ObjectWithFrame::setFrame(&this_01->object,local_50.frames[iVar5]);
          this_01->clump = this;
          (this_01->inClump).next = local_58;
          pLVar1 = (this->cameras).link.prev;
          (this_01->inClump).prev = pLVar1;
          pLVar1->next = &this_01->inClump;
          (this->cameras).link.prev = &this_01->inClump;
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_34);
      }
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          if (geometryList[uVar10] != (Geometry *)0x0) {
            Geometry::destroy(geometryList[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      (*DAT_0014ada0)(geometryList);
      (*DAT_0014ada0)(local_50.frames);
      bVar3 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
      if (bVar3) {
        return this;
      }
LAB_0012ec73:
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          if (geometryList[uVar10] != (Geometry *)0x0) {
            Geometry::destroy(geometryList[uVar10]);
          }
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      (*DAT_0014ada0)(geometryList);
    }
  }
  else {
    streamRead();
  }
LAB_0012eca0:
  (*DAT_0014ada0)(local_50.frames);
  destroy(this);
  return (Clump *)0x0;
}

Assistant:

Clump*
Clump::streamRead(Stream *stream)
{
	uint32 length, version;
	int32 buf[3];
	Clump *clump;
	int32 numGeometries;
	Geometry **geometryList;

	if(!findChunk(stream, ID_STRUCT, &length, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(buf, length);
	int32 numAtomics = buf[0];
	int32 numLights = 0;
	int32 numCameras = 0;
	if(version > 0x33000){
		numLights = buf[1];
		numCameras = buf[2];
	}
	clump = Clump::create();
	if(clump == nil)
		return nil;

	// Frame list
	FrameList_ frmlst;
	frmlst.frames = nil;
	if(!findChunk(stream, ID_FRAMELIST, nil, nil)){
		RWERROR((ERR_CHUNK, "FRAMELIST"));
		goto fail;
	}
	if(frmlst.streamRead(stream) == nil)
		goto fail;
	clump->setFrame(frmlst.frames[0]);

	// Geometry list
	numGeometries = 0;
	geometryList = nil;
	if(version >= 0x30400){
		if(!findChunk(stream, ID_GEOMETRYLIST, nil, nil)){
			RWERROR((ERR_CHUNK, "GEOMETRYLIST"));
			goto fail;
		}
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto fail;
		}
		numGeometries = stream->readI32();
		if(numGeometries){
			size_t sz = numGeometries*sizeof(Geometry*);
			geometryList = (Geometry**)rwMalloc(sz, MEMDUR_FUNCTION | ID_CLUMP);
			if(geometryList == nil){
				RWERROR((ERR_ALLOC, sz));
				goto fail;
			}
			memset(geometryList, 0, sz);
		}
		for(int32 i = 0; i < numGeometries; i++){
			if(!findChunk(stream, ID_GEOMETRY, nil, nil)){
				RWERROR((ERR_CHUNK, "GEOMETRY"));
				goto failgeo;
			}
			geometryList[i] = Geometry::streamRead(stream);
			if(geometryList[i] == nil)
				goto failgeo;
		}
	}

	// Atomics
	Atomic *a;
	for(int32 i = 0; i < numAtomics; i++){
		if(!findChunk(stream, ID_ATOMIC, nil, nil)){
			RWERROR((ERR_CHUNK, "ATOMIC"));
			goto failgeo;
		}
		a = Atomic::streamReadClump(stream, &frmlst, geometryList);
		if(a == nil)
			goto failgeo;
		clump->addAtomic(a);
	}

	// Lights
	int32 frm;
	Light *l;
	for(int32 i = 0; i < numLights; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_LIGHT, nil, nil)){
			RWERROR((ERR_CHUNK, "LIGHT"));
			goto failgeo;
		}
		l = Light::streamRead(stream);
		if(l == nil)
			goto failgeo;
		l->setFrame(frmlst.frames[frm]);
		clump->addLight(l);
	}

	// Cameras
	Camera *cam;
	for(int32 i = 0; i < numCameras; i++){
		if(!findChunk(stream, ID_STRUCT, nil, nil)){
			RWERROR((ERR_CHUNK, "STRUCT"));
			goto failgeo;
		}
		frm = stream->readI32();
		if(!findChunk(stream, ID_CAMERA, nil, nil)){
			RWERROR((ERR_CHUNK, "CAMERA"));
			goto failgeo;
		}
		cam = Camera::streamRead(stream);
		if(cam == nil)
			goto failgeo;
		cam->setFrame(frmlst.frames[frm]);
		clump->addCamera(cam);
	}

	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
	rwFree(frmlst.frames);
	if(s_plglist.streamRead(stream, clump))
		return clump;

failgeo:
	for(int32 i = 0; i < numGeometries; i++)
		if(geometryList[i])
			geometryList[i]->destroy();
	rwFree(geometryList);
fail:
	rwFree(frmlst.frames);
	clump->destroy();
	return nil;
}